

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client_http.hpp
# Opt level: O3

pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short>
* __thiscall
SimpleWeb::
ClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>_>::
parse_host_port(pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short>
                *__return_storage_ptr__,
               ClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>_>
               *this,string *host_port,unsigned_short default_port)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char cVar2;
  size_type sVar3;
  pointer pcVar4;
  char *__nptr;
  bool bVar5;
  int *piVar6;
  ulong uVar7;
  undefined8 uVar8;
  size_type sVar9;
  int iVar10;
  string host;
  string port;
  _Alloc_hider local_78;
  size_type local_70;
  uint local_68;
  undefined4 uStack_64;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  char *local_58;
  long local_50;
  char local_48;
  undefined7 uStack_47;
  char *local_38;
  
  local_78._M_p = (pointer)&local_68;
  local_70 = 0;
  local_68 = local_68 & 0xffffff00;
  local_58 = &local_48;
  local_50 = 0;
  local_48 = '\0';
  std::__cxx11::string::reserve((ulong)&local_78);
  sVar3 = host_port->_M_string_length;
  if (sVar3 != 0) {
    pcVar4 = (host_port->_M_dataplus)._M_p;
    sVar9 = 0;
    bVar5 = false;
    iVar10 = 0;
    do {
      cVar2 = pcVar4[sVar9];
      if (cVar2 == ']') {
        iVar10 = iVar10 + -1;
      }
      else if (cVar2 == '[') {
        iVar10 = iVar10 + 1;
      }
      else if (iVar10 == 0 && cVar2 == ':') {
        iVar10 = 0;
        bVar5 = true;
      }
      else if (bVar5) {
        std::__cxx11::string::push_back((char)&local_58);
        bVar5 = true;
      }
      else {
        std::__cxx11::string::push_back((char)&local_78);
        bVar5 = false;
      }
      sVar9 = sVar9 + 1;
    } while (sVar3 != sVar9);
  }
  __nptr = local_58;
  if (local_50 == 0) {
LAB_0019266d:
    paVar1 = &(__return_storage_ptr__->first).field_2;
    (__return_storage_ptr__->first)._M_dataplus._M_p = (pointer)paVar1;
    if ((uint *)local_78._M_p == &local_68) {
      paVar1->_M_allocated_capacity = CONCAT44(uStack_64,local_68);
      *(ulong *)((long)&(__return_storage_ptr__->first).field_2 + 8) = CONCAT44(uStack_5c,uStack_60)
      ;
    }
    else {
      (__return_storage_ptr__->first)._M_dataplus._M_p = local_78._M_p;
      (__return_storage_ptr__->first).field_2._M_allocated_capacity = CONCAT44(uStack_64,local_68);
    }
  }
  else {
    piVar6 = __errno_location();
    iVar10 = *piVar6;
    *piVar6 = 0;
    uVar7 = strtoul(__nptr,&local_38,10);
    if (local_38 == __nptr) {
      uVar8 = std::__throw_invalid_argument("stoul");
      if (*piVar6 == 0) {
        *piVar6 = iVar10;
      }
      __cxa_begin_catch(uVar8);
      paVar1 = &(__return_storage_ptr__->first).field_2;
      (__return_storage_ptr__->first)._M_dataplus._M_p = (pointer)paVar1;
      if ((uint *)local_78._M_p == &local_68) {
        *(uint *)paVar1 = local_68;
        *(undefined4 *)((long)&(__return_storage_ptr__->first).field_2 + 4) = uStack_64;
        *(undefined4 *)((long)&(__return_storage_ptr__->first).field_2 + 8) = uStack_60;
        *(undefined4 *)((long)&(__return_storage_ptr__->first).field_2 + 0xc) = uStack_5c;
      }
      else {
        (__return_storage_ptr__->first)._M_dataplus._M_p = local_78._M_p;
        (__return_storage_ptr__->first).field_2._M_allocated_capacity = CONCAT44(uStack_64,local_68)
        ;
      }
      (__return_storage_ptr__->first)._M_string_length = local_70;
      local_78._M_p = (pointer)&local_68;
      local_70 = 0;
      local_68 = local_68 & 0xffffff00;
      __return_storage_ptr__->second = default_port;
      __cxa_end_catch();
      goto LAB_001926f8;
    }
    if (*piVar6 == 0) {
      *piVar6 = iVar10;
    }
    else if (*piVar6 == 0x22) {
      std::__throw_out_of_range("stoul");
      goto LAB_0019266d;
    }
    default_port = (unsigned_short)uVar7;
    paVar1 = &(__return_storage_ptr__->first).field_2;
    (__return_storage_ptr__->first)._M_dataplus._M_p = (pointer)paVar1;
    if ((uint *)local_78._M_p == &local_68) {
      paVar1->_M_allocated_capacity = CONCAT44(uStack_64,local_68);
      *(ulong *)((long)&(__return_storage_ptr__->first).field_2 + 8) = CONCAT44(uStack_5c,uStack_60)
      ;
    }
    else {
      (__return_storage_ptr__->first)._M_dataplus._M_p = local_78._M_p;
      (__return_storage_ptr__->first).field_2._M_allocated_capacity = CONCAT44(uStack_64,local_68);
    }
  }
  local_78._M_p = (pointer)&local_68;
  (__return_storage_ptr__->first)._M_string_length = local_70;
  local_70 = 0;
  local_68 = local_68 & 0xffffff00;
  __return_storage_ptr__->second = default_port;
LAB_001926f8:
  if (local_58 != &local_48) {
    operator_delete(local_58,CONCAT71(uStack_47,local_48) + 1);
  }
  if ((uint *)local_78._M_p != &local_68) {
    operator_delete(local_78._M_p,CONCAT44(uStack_64,local_68) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::pair<std::string, unsigned short> parse_host_port(const std::string &host_port, unsigned short default_port) const noexcept {
      std::string host, port;
      host.reserve(host_port.size());
      bool parse_port = false;
      int square_count = 0; // To parse IPv6 addresses
      for(auto chr : host_port) {
        if(chr == '[')
          ++square_count;
        else if(chr == ']')
          --square_count;
        else if(square_count == 0 && chr == ':')
          parse_port = true;
        else if(!parse_port)
          host += chr;
        else
          port += chr;
      }

      if(port.empty())
        return {std::move(host), default_port};
      else {
        try {
          return {std::move(host), static_cast<unsigned short>(std::stoul(port))};
        }
        catch(...) {
          return {std::move(host), default_port};
        }
      }
    }